

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_unix.c
# Opt level: O2

int w_mtx_lock(pthread_mutex_t *mtx)

{
  int iVar1;
  
  if (mtx == (pthread_mutex_t *)0x0) {
    _exit(-1);
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)mtx);
  return iVar1;
}

Assistant:

int
w_mtx_lock(
    pthread_mutex_t *mtx
)
{
    int error;

    WP_PLATFORM_ASSERT(mtx != NULL);

    error = pthread_mutex_lock(mtx);
    if (error != 0)
    {
        return error;
    }

    return 0;
}